

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall VmaJsonWriter::WriteString(VmaJsonWriter *this,char *pStr)

{
  BeginString(this,pStr);
  EndString(this,(char *)0x0);
  return;
}

Assistant:

void VmaJsonWriter::WriteString(const char* pStr)
{
    BeginString(pStr);
    EndString();
}